

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void delete_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  out_edge_t peVar1;
  in_edge_t_conflict peVar2;
  edge_t_conflict next_e;
  edge_t_conflict e;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  next_e = DLIST_out_edge_t_head(&bb->out_edges);
  while (next_e != (edge_t_conflict)0x0) {
    peVar1 = DLIST_out_edge_t_next(next_e);
    delete_edge(next_e);
    next_e = peVar1;
  }
  next_e = DLIST_in_edge_t_head(&bb->in_edges);
  while (next_e != (edge_t_conflict)0x0) {
    peVar2 = DLIST_in_edge_t_next(next_e);
    delete_edge(next_e);
    next_e = peVar2;
  }
  if (bb->loop_node != (loop_node_t_conflict)0x0) {
    if (bb->loop_node->parent->entry == bb->loop_node) {
      bb->loop_node->parent->entry = (loop_node_t)0x0;
    }
    DLIST_loop_node_t_remove(&bb->loop_node->parent->children,bb->loop_node);
    if ((bb->loop_node->u).preheader != (loop_node_t)0x0) {
      (((bb->loop_node->u).preheader)->u).preheader = (loop_node_t)0x0;
    }
    free(bb->loop_node);
  }
  DLIST_bb_t_remove(&gen_ctx->curr_cfg->bbs,bb);
  bitmap_destroy(bb->in);
  bitmap_destroy(bb->out);
  bitmap_destroy(bb->gen);
  bitmap_destroy(bb->kill);
  bitmap_destroy(bb->dom_in);
  bitmap_destroy(bb->dom_out);
  free(bb);
  return;
}

Assistant:

static void delete_bb (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, next_e;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = next_e) {
    next_e = DLIST_NEXT (out_edge_t, e);
    delete_edge (e);
  }
  for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = next_e) {
    next_e = DLIST_NEXT (in_edge_t, e);
    delete_edge (e);
  }
  if (bb->loop_node != NULL) {
    if (bb->loop_node->parent->entry == bb->loop_node) bb->loop_node->parent->entry = NULL;
    DLIST_REMOVE (loop_node_t, bb->loop_node->parent->children, bb->loop_node);
    if (bb->loop_node->u.preheader_loop != NULL)
      bb->loop_node->u.preheader_loop->u.preheader = NULL;
    free (bb->loop_node);
  }
  DLIST_REMOVE (bb_t, curr_cfg->bbs, bb);
  bitmap_destroy (bb->in);
  bitmap_destroy (bb->out);
  bitmap_destroy (bb->gen);
  bitmap_destroy (bb->kill);
  bitmap_destroy (bb->dom_in);
  bitmap_destroy (bb->dom_out);
  free (bb);
}